

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kstring.c
# Opt level: O0

void * kmemmem(void *_str,int n,void *_pat,int m,int **_prep)

{
  bool bVar1;
  int *local_78;
  int local_6c;
  int max;
  ubyte_t *pat;
  ubyte_t *str;
  int *bmBc;
  int *bmGs;
  int *prep;
  int j;
  int i;
  int **_prep_local;
  int m_local;
  void *_pat_local;
  int n_local;
  void *_str_local;
  
  if ((_prep == (int **)0x0) || (*_prep == (int *)0x0)) {
    local_78 = ksBM_prep((ubyte_t *)_pat,m);
  }
  else {
    local_78 = *_prep;
  }
  if ((_prep != (int **)0x0) && (*_prep == (int *)0x0)) {
    *_prep = local_78;
  }
  prep._0_4_ = 0;
  while( true ) {
    if (n - m < (int)prep) {
      if (_prep == (int **)0x0) {
        free(local_78);
      }
      return (void *)0x0;
    }
    prep._4_4_ = m + -1;
    while( true ) {
      bVar1 = false;
      if (-1 < prep._4_4_) {
        bVar1 = *(char *)((long)_pat + (long)prep._4_4_) ==
                *(char *)((long)_str + (long)(prep._4_4_ + (int)prep));
      }
      if (!bVar1) break;
      prep._4_4_ = prep._4_4_ + -1;
    }
    if (prep._4_4_ < 0) break;
    local_6c = (local_78[(long)m + (ulong)*(byte *)((long)_str + (long)(prep._4_4_ + (int)prep))] -
               m) + 1 + prep._4_4_;
    if (local_6c < local_78[prep._4_4_]) {
      local_6c = local_78[prep._4_4_];
    }
    prep._0_4_ = local_6c + (int)prep;
  }
  return (void *)((long)_str + (long)(int)prep);
}

Assistant:

void *kmemmem(const void *_str, int n, const void *_pat, int m, int **_prep)
{
	int i, j, *prep = 0, *bmGs, *bmBc;
	const ubyte_t *str, *pat;
	str = (const ubyte_t*)_str; pat = (const ubyte_t*)_pat;
	prep = (_prep == 0 || *_prep == 0)? ksBM_prep(pat, m) : *_prep;
	if (_prep && *_prep == 0) *_prep = prep;
	bmGs = prep; bmBc = prep + m;
	j = 0;
	while (j <= n - m) {
		for (i = m - 1; i >= 0 && pat[i] == str[i+j]; --i);
		if (i >= 0) {
			int max = bmBc[str[i+j]] - m + 1 + i;
			if (max < bmGs[i]) max = bmGs[i];
			j += max;
		} else return (void*)(str + j);
	}
	if (_prep == 0) free(prep);
	return 0;
}